

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O2

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar4 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (pmVar1 = pZip->m_pState, uVar4 = uVar3, pmVar1 != (mz_zip_internal_state *)0x0)) &&
      (file_index < pZip->m_total_files)) &&
     ((pZip->m_zip_mode == MZ_ZIP_MODE_READING &&
      (pvVar2 = (pmVar1->m_central_dir).m_p, pvVar2 != (void *)0x0)))) {
    uVar4 = *(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    uVar5 = (ulong)*(ushort *)((long)pvVar2 + (ulong)uVar4 + 0x1c);
    if ((uVar5 != 0) && (*(char *)((long)pvVar2 + uVar5 + (ulong)uVar4 + 0x2d) == '/')) {
      return 1;
    }
    uVar4 = *(uint *)((long)pvVar2 + (ulong)uVar4 + 0x26) >> 4 & 1;
  }
  return uVar4;
}

Assistant:

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip, mz_uint file_index)
{
    mz_uint filename_len, attribute_mapping_id, external_attr;
    const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
    if (!p)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return MZ_FALSE;
    }

    filename_len = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    if (filename_len)
    {
        if (*(p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_len - 1) == '/')
            return MZ_TRUE;
    }

    /* Bugfix: This code was also checking if the internal attribute was non-zero, which wasn't correct. */
    /* Most/all zip writers (hopefully) set DOS file/directory attributes in the low 16-bits, so check for the DOS directory flag and ignore the source OS ID in the created by field. */
    /* FIXME: Remove this check? Is it necessary - we already check the filename. */
    attribute_mapping_id = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS) >> 8;
    (void)attribute_mapping_id;

    external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    if ((external_attr & MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG) != 0)
    {
        return MZ_TRUE;
    }

    return MZ_FALSE;
}